

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int MRIStepSetCoupling(void *arkode_mem,MRIStepCoupling MRIC)

{
  MRIStepCoupling pMVar1;
  long in_RSI;
  sunindextype Tliw;
  sunindextype Tlrw;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  ARKodeMem *in_stack_ffffffffffffffb8;
  MRIStepCoupling in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  long local_30;
  ARKodeMem in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = mriStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                       in_stack_ffffffffffffffb8,(ARKodeMRIStepMem *)0x165239);
  if (local_4 == 0) {
    if (in_RSI == 0) {
      arkProcessError(in_stack_ffffffffffffffd8,-0x15,0x32,"MRIStepSetCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"The MRIStepCoupling is NULL.");
      local_4 = -0x16;
    }
    else {
      *(undefined4 *)(local_30 + 0x48) = 0;
      *(undefined4 *)(local_30 + 0x40) = 0;
      *(undefined4 *)(local_30 + 0x44) = 0;
      MRIStepCoupling_Space
                (*(MRIStepCoupling *)(local_30 + 0x38),(sunindextype *)&stack0xffffffffffffffc0,
                 (sunindextype *)&stack0xffffffffffffffc8);
      MRIStepCoupling_Free(in_stack_ffffffffffffffc0);
      *(undefined8 *)(local_30 + 0x38) = 0;
      in_stack_ffffffffffffffd8->liw =
           in_stack_ffffffffffffffd8->liw - (long)in_stack_ffffffffffffffc0;
      in_stack_ffffffffffffffd8->lrw =
           in_stack_ffffffffffffffd8->lrw - (long)in_stack_ffffffffffffffc8;
      *(undefined4 *)(local_30 + 0x48) = *(undefined4 *)(in_RSI + 4);
      *(undefined4 *)(local_30 + 0x40) = *(undefined4 *)(in_RSI + 8);
      *(undefined4 *)(local_30 + 0x44) = *(undefined4 *)(in_RSI + 0xc);
      pMVar1 = MRIStepCoupling_Copy((MRIStepCoupling)in_stack_ffffffffffffffd8);
      *(MRIStepCoupling *)(local_30 + 0x38) = pMVar1;
      if (*(long *)(local_30 + 0x38) == 0) {
        arkProcessError(in_stack_ffffffffffffffd8,-0x15,0x4a,"MRIStepSetCoupling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                        ,"The MRIStepCoupling is NULL.");
        local_4 = -0x15;
      }
      else {
        MRIStepCoupling_Space
                  (*(MRIStepCoupling *)(local_30 + 0x38),(sunindextype *)&stack0xffffffffffffffc0,
                   (sunindextype *)&stack0xffffffffffffffc8);
        in_stack_ffffffffffffffd8->liw =
             (long)&in_stack_ffffffffffffffc0->nmat + in_stack_ffffffffffffffd8->liw;
        in_stack_ffffffffffffffd8->lrw =
             (long)in_stack_ffffffffffffffc8 + in_stack_ffffffffffffffd8->lrw;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int MRIStepSetCoupling(void* arkode_mem, MRIStepCoupling MRIC)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check for illegal inputs */
  if (MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_COUPLING);
    return (ARK_ILL_INPUT);
  }

  /* clear any existing parameters and coupling structure */
  step_mem->stages = 0;
  step_mem->q      = 0;
  step_mem->p      = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  /* set the relevant parameters */
  step_mem->stages = MRIC->stages;
  step_mem->q      = MRIC->q;
  step_mem->p      = MRIC->p;

  /* copy the coupling structure in step memory */
  step_mem->MRIC = MRIStepCoupling_Copy(MRIC);
  if (step_mem->MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_COUPLING);
    return (ARK_MEM_NULL);
  }
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  ark_mem->liw += Tliw;
  ark_mem->lrw += Tlrw;

  return (ARK_SUCCESS);
}